

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tb_invalidate_phys_range_arm(uc_struct_conflict1 *uc,ram_addr_t start,ram_addr_t end)

{
  page_collection *mem;
  ulong uVar1;
  PageDesc *pages;
  PageDesc *start_00;
  long lVar2;
  tb_page_addr_t in_R8;
  uintptr_t in_R9;
  PageDesc *pPVar3;
  bool bVar4;
  
  mem = page_collection_lock_arm(uc,start,end);
  if (end != start && -1 < (long)(end - start)) {
    uVar1 = (ulong)uc->init_target_page->mask;
    pPVar3 = (PageDesc *)((uVar1 & start) - uVar1);
    do {
      pages = page_find_alloc(uc,start >> ((byte)uc->init_target_page->bits & 0x3f),0);
      if (pages != (PageDesc *)0x0) {
        start_00 = (PageDesc *)end;
        if (pPVar3 < end) {
          start_00 = pPVar3;
        }
        tb_invalidate_phys_page_range__locked
                  (uc,(page_collection *)pages,(PageDesc *)start,(tb_page_addr_t)start_00,in_R8,
                   in_R9);
      }
      lVar2 = end - (long)pPVar3;
      bVar4 = (PageDesc *)end != pPVar3;
      start = (ram_addr_t)pPVar3;
      pPVar3 = (PageDesc *)((long)pPVar3 - (long)uc->init_target_page->mask);
    } while (bVar4 && -1 < lVar2);
  }
  g_tree_destroy(mem->tree);
  g_free(mem);
  return;
}

Assistant:

void tb_invalidate_phys_range(struct uc_struct *uc, ram_addr_t start, ram_addr_t end)
{
    struct page_collection *pages;
    tb_page_addr_t next;

    assert_memory_lock();

    pages = page_collection_lock(uc, start, end);
    for (next = (start & TARGET_PAGE_MASK) + TARGET_PAGE_SIZE;
         //start < end; Unicorn: Fix possible wrap around
         (intptr_t)(end - start) > 0;
         start = next, next += TARGET_PAGE_SIZE) {
        PageDesc *pd = page_find(uc, start >> TARGET_PAGE_BITS);
        tb_page_addr_t bound = MIN(next, end);

        if (pd == NULL) {
            continue;
        }
        tb_invalidate_phys_page_range__locked(uc, pages, pd, start, bound, 0);
    }
    page_collection_unlock(pages);
}